

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

void __thiscall Search::predictor::predictor(predictor *this,search *sch,ptag my_tag)

{
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined1 *in_RDI;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  *in_RDI = 0;
  *(undefined4 *)(in_RDI + 4) = in_EDX;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  in_RDI[0x18] = 0;
  *(undefined4 *)(in_RDI + 0x1c) = 0x3f800000;
  in_RDI[0x40] = 0;
  in_RDI[0xa8] = 0;
  in_RDI[0xd0] = 0;
  *(undefined8 *)(in_RDI + 0xd8) = 0;
  *(undefined8 *)(in_RDI + 0xe0) = in_RSI;
  v_init<unsigned_int>();
  *(undefined8 *)(in_RDI + 0x20) = local_38;
  *(undefined8 *)(in_RDI + 0x28) = local_30;
  *(undefined8 *)(in_RDI + 0x30) = local_28;
  *(undefined8 *)(in_RDI + 0x38) = local_20;
  v_init<unsigned_int>();
  *(undefined8 *)(in_RDI + 0x48) = local_58;
  *(undefined8 *)(in_RDI + 0x50) = local_50;
  *(undefined8 *)(in_RDI + 0x58) = local_48;
  *(undefined8 *)(in_RDI + 0x60) = local_40;
  v_init<char>();
  *(undefined8 *)(in_RDI + 0x68) = local_78;
  *(undefined8 *)(in_RDI + 0x70) = local_70;
  *(undefined8 *)(in_RDI + 0x78) = local_68;
  *(undefined8 *)(in_RDI + 0x80) = local_60;
  v_init<unsigned_int>();
  *(undefined8 *)(in_RDI + 0x88) = local_98;
  *(undefined8 *)(in_RDI + 0x90) = local_90;
  *(undefined8 *)(in_RDI + 0x98) = local_88;
  *(undefined8 *)(in_RDI + 0xa0) = local_80;
  v_init<float>();
  *(undefined8 *)(in_RDI + 0xb0) = local_b8;
  *(undefined8 *)(in_RDI + 0xb8) = local_b0;
  *(undefined8 *)(in_RDI + 0xc0) = local_a8;
  *(undefined8 *)(in_RDI + 200) = local_a0;
  return;
}

Assistant:

predictor::predictor(search& sch, ptag my_tag)
    : is_ldf(false)
    , my_tag(my_tag)
    , ec(nullptr)
    , ec_cnt(0)
    , ec_alloced(false)
    , weight(1.)
    , oracle_is_pointer(false)
    , allowed_is_pointer(false)
    , allowed_cost_is_pointer(false)
    , learner_id(0)
    , sch(sch)
{
  oracle_actions = v_init<action>();
  condition_on_tags = v_init<ptag>();
  condition_on_names = v_init<char>();
  allowed_actions = v_init<action>();
  allowed_actions_cost = v_init<float>();
}